

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReaderSeek(SortSubtask *pTask,PmaReader *pReadr,SorterFile *pFile,i64 iOff)

{
  int iVar1;
  u8 *puVar2;
  int local_40;
  int nRead;
  int iBuf;
  int pgsz;
  int rc;
  i64 iOff_local;
  SorterFile *pFile_local;
  PmaReader *pReadr_local;
  SortSubtask *pTask_local;
  
  iVar1 = sqlite3FaultSim(0xc9);
  if (iVar1 == 0) {
    if (pReadr->aMap != (u8 *)0x0) {
      sqlite3OsUnfetch(pReadr->pFd,0,pReadr->aMap);
      pReadr->aMap = (u8 *)0x0;
    }
    pReadr->iReadOff = iOff;
    pReadr->iEof = pFile->iEof;
    pReadr->pFd = pFile->pFd;
    iBuf = vdbeSorterMapFile(pTask,pFile,&pReadr->aMap);
    if ((iBuf == 0) && (pReadr->aMap == (u8 *)0x0)) {
      local_40 = pTask->pSorter->pgsz;
      iVar1 = (int)(pReadr->iReadOff % (long)local_40);
      if (pReadr->aBuffer == (u8 *)0x0) {
        puVar2 = (u8 *)sqlite3Malloc((long)local_40);
        pReadr->aBuffer = puVar2;
        if (pReadr->aBuffer == (u8 *)0x0) {
          iBuf = 7;
        }
        pReadr->nBuffer = local_40;
      }
      if ((iBuf == 0) && (iVar1 != 0)) {
        local_40 = local_40 - iVar1;
        if (pReadr->iEof < pReadr->iReadOff + (long)local_40) {
          local_40 = (int)pReadr->iEof - (int)pReadr->iReadOff;
        }
        iBuf = sqlite3OsRead(pReadr->pFd,pReadr->aBuffer + iVar1,local_40,pReadr->iReadOff);
      }
    }
    pTask_local._4_4_ = iBuf;
  }
  else {
    pTask_local._4_4_ = 0x10a;
  }
  return pTask_local._4_4_;
}

Assistant:

static int vdbePmaReaderSeek(
  SortSubtask *pTask,             /* Task context */
  PmaReader *pReadr,              /* Reader whose cursor is to be moved */
  SorterFile *pFile,              /* Sorter file to read from */
  i64 iOff                        /* Offset in pFile */
){
  int rc = SQLITE_OK;

  assert( pReadr->pIncr==0 || pReadr->pIncr->bEof==0 );

  if( sqlite3FaultSim(201) ) return SQLITE_IOERR_READ;
  if( pReadr->aMap ){
    sqlite3OsUnfetch(pReadr->pFd, 0, pReadr->aMap);
    pReadr->aMap = 0;
  }
  pReadr->iReadOff = iOff;
  pReadr->iEof = pFile->iEof;
  pReadr->pFd = pFile->pFd;

  rc = vdbeSorterMapFile(pTask, pFile, &pReadr->aMap);
  if( rc==SQLITE_OK && pReadr->aMap==0 ){
    int pgsz = pTask->pSorter->pgsz;
    int iBuf = pReadr->iReadOff % pgsz;
    if( pReadr->aBuffer==0 ){
      pReadr->aBuffer = (u8*)sqlite3Malloc(pgsz);
      if( pReadr->aBuffer==0 ) rc = SQLITE_NOMEM_BKPT;
      pReadr->nBuffer = pgsz;
    }
    if( rc==SQLITE_OK && iBuf ){
      int nRead = pgsz - iBuf;
      if( (pReadr->iReadOff + nRead) > pReadr->iEof ){
        nRead = (int)(pReadr->iEof - pReadr->iReadOff);
      }
      rc = sqlite3OsRead(
          pReadr->pFd, &pReadr->aBuffer[iBuf], nRead, pReadr->iReadOff
      );
      testcase( rc!=SQLITE_OK );
    }
  }

  return rc;
}